

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapInsertNode(jx9_hashmap *pMap,jx9_hashmap_node *pNode,int bPreserve)

{
  jx9_vm *pjVar1;
  sxi32 sVar2;
  jx9_value *pValue;
  
  pjVar1 = pNode->pMap->pVm;
  if (pNode->nValIdx < (pjVar1->aMemObj).nUsed) {
    pValue = (jx9_value *)
             ((ulong)(pNode->nValIdx * (pjVar1->aMemObj).eSize) + (long)(pjVar1->aMemObj).pBase);
  }
  else {
    pValue = (jx9_value *)0x0;
  }
  if (pValue != (jx9_value *)0x0) {
    if (pNode->iType == 1) {
      sVar2 = HashmapInsertIntKey(pMap,(pNode->xKey).iKey,pValue);
      return sVar2;
    }
    sVar2 = HashmapInsertBlobKey(pMap,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte,pValue);
    return sVar2;
  }
  return (sxi32)pjVar1;
}

Assistant:

static sxi32 HashmapInsertNode(jx9_hashmap *pMap, jx9_hashmap_node *pNode, int bPreserve)
{
	jx9_value *pObj;
	sxi32 rc;
	/* Extract the node value */
	pObj = HashmapExtractNodeValue(&(*pNode));
	if( pObj == 0 ){
		return SXERR_EMPTY;
	}
	/* Preserve key */
	if( pNode->iType == HASHMAP_INT_NODE){
		/* Int64 key */
		if( !bPreserve ){
			/* Assign an automatic index */
			rc = HashmapInsert(&(*pMap), 0, pObj);
		}else{
			rc = HashmapInsertIntKey(&(*pMap), pNode->xKey.iKey, pObj);
		}
	}else{
		/* Blob key */
		rc = HashmapInsertBlobKey(&(*pMap), SyBlobData(&pNode->xKey.sKey), 
			SyBlobLength(&pNode->xKey.sKey), pObj);
	}
	return rc;
}